

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cpp
# Opt level: O2

void dlib::impl1::send_out_connection_orders
               (map_id_to_con *cons,
               vector<dlib::network_address,_std::allocator<dlib::network_address>_> *hosts)

{
  char cVar1;
  long *plVar2;
  unsigned_long *puVar3;
  range *prVar4;
  unsigned_long uVar5;
  long lVar6;
  vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_> targets;
  unsigned_long num;
  hostinfo info;
  
  (**(code **)(*(long *)cons + 0x18))();
  while( true ) {
    cVar1 = (**(code **)(*(long *)cons + 0x38))(cons);
    if (cVar1 == '\0') break;
    plVar2 = (long *)(**(code **)(*(long *)cons + 0x30))(cons);
    puVar3 = (unsigned_long *)(**(code **)(*plVar2 + 0x10))(plVar2);
    plVar2 = (long *)(**(code **)(*(long *)cons + 0x30))(cons);
    plVar2 = (long *)(**(code **)(*plVar2 + 0x20))(plVar2);
    dlib::serialize(puVar3,(ostream *)(*plVar2 + 0x78));
  }
  targets.super__Vector_base<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  targets.super__Vector_base<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  targets.super__Vector_base<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = 1;
  puVar3 = &info.node_id;
  lVar6 = 0;
  while( true ) {
    if ((ulong)((*(long *)(hosts + 8) - *(long *)hosts) / 0x28) <= uVar5 - 1) break;
    network_address::network_address(&info.addr,(network_address *)(*(long *)hosts + lVar6));
    info.node_id = uVar5;
    prVar4 = map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
             ::operator[](cons,puVar3);
    serialize<dlib::impl1::hostinfo,std::allocator<dlib::impl1::hostinfo>>
              (&targets,(ostream *)
                        ((long)&(((prVar4->_M_t).
                                  super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
                                  .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>._M_head_impl
                                 )->stream).super_basic_istream<char,_std::char_traits<char>_> +
                        0x10));
    std::vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>::push_back
              (&targets,&info);
    num = ((long)targets.
                 super__Vector_base<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)targets.
                super__Vector_base<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>.
                _M_impl.super__Vector_impl_data._M_start) / -0x30 +
          (*(long *)(hosts + 8) - *(long *)hosts) / 0x28;
    prVar4 = map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
             ::operator[](cons,puVar3);
    dlib::serialize(&num,(ostream *)
                         ((long)&(((prVar4->_M_t).
                                   super___uniq_ptr_impl<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_dlib::impl1::bsp_con_*,_std::default_delete<dlib::impl1::bsp_con>_>
                                   .super__Head_base<0UL,_dlib::impl1::bsp_con_*,_false>.
                                  _M_head_impl)->stream).
                                 super_basic_istream<char,_std::char_traits<char>_> + 0x10));
    map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
    ::operator[](cons,puVar3);
    std::ostream::flush();
    std::__cxx11::string::~string((string *)&info);
    lVar6 = lVar6 + 0x28;
    uVar5 = uVar5 + 1;
  }
  std::vector<dlib::impl1::hostinfo,_std::allocator<dlib::impl1::hostinfo>_>::~vector(&targets);
  return;
}

Assistant:

void send_out_connection_orders (
            map_id_to_con& cons,
            const std::vector<network_address>& hosts
        )
        {
            // tell everyone their node ids
            cons.reset();
            while (cons.move_next())
            {
                dlib::serialize(cons.element().key(), cons.element().value()->stream);
            }

            // now tell them who to connect to
            std::vector<hostinfo> targets; 
            for (unsigned long i = 0; i < hosts.size(); ++i)
            {
                hostinfo info(hosts[i], i+1);

                dlib::serialize(targets, cons[info.node_id]->stream);
                targets.push_back(info);

                // let the other host know how many incoming connections to expect
                const unsigned long num = hosts.size()-targets.size();
                dlib::serialize(num, cons[info.node_id]->stream);
                cons[info.node_id]->stream.flush();
            }
        }